

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

void __thiscall
ON__CChangeTextureCoordinateHelper::ChangeTextureCoordinate
          (ON__CChangeTextureCoordinateHelper *this,int *Fvi,int fvi,float x,float y,float *mesh_T,
          int mesh_T_stride)

{
  int vi;
  int iVar1;
  float *pfVar2;
  int newvi;
  float *T;
  int oldvi;
  int mesh_T_stride_local;
  float *mesh_T_local;
  float y_local;
  float x_local;
  int fvi_local;
  int *Fvi_local;
  ON__CChangeTextureCoordinateHelper *this_local;
  
  vi = Fvi[fvi];
  pfVar2 = mesh_T + vi * mesh_T_stride;
  if ((x == *pfVar2) && (!NAN(x) && !NAN(*pfVar2))) {
    if ((y == -1.234321e+38) && (!NAN(y))) {
      return;
    }
    if ((y == pfVar2[1]) && (!NAN(y) && !NAN(pfVar2[1]))) {
      return;
    }
  }
  iVar1 = DupVertex(this,vi);
  mesh_T[iVar1 * mesh_T_stride] = x;
  if ((y != -1.234321e+38) || (NAN(y))) {
    (mesh_T + iVar1 * mesh_T_stride)[1] = y;
  }
  if ((fvi == 2) && (vi == Fvi[3])) {
    Fvi[2] = iVar1;
    Fvi[3] = iVar1;
  }
  else {
    Fvi[fvi] = iVar1;
  }
  return;
}

Assistant:

void ON__CChangeTextureCoordinateHelper::ChangeTextureCoordinate(int* Fvi, int fvi, float x, float y,
                                                             float* mesh_T, int mesh_T_stride )
{
  int oldvi = Fvi[fvi];
  float* T = mesh_T+(oldvi*mesh_T_stride);
  if ( x != T[0] || (y != ON_UNSET_FLOAT && y != T[1]) )
  {
    int newvi = DupVertex(oldvi);
    T = mesh_T + (newvi*mesh_T_stride);
    T[0] = x;
    if ( y != ON_UNSET_FLOAT )
     T[1] = y;

    if ( 2 == fvi && oldvi == Fvi[3] )
    {
      Fvi[2] = newvi;
      Fvi[3] = newvi;
    }
    else
    {
      Fvi[fvi] = newvi;
    }
  }
}